

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O1

method class_get_method_type_safe(vector v,type_id ret,type_id *args,size_t size)

{
  method_conflict m;
  int iVar1;
  ulong uVar2;
  undefined8 *puVar3;
  signature s;
  ulong uVar4;
  bool bVar5;
  method_conflict local_48;
  
  if (v != (vector)0x0) {
    uVar2 = vector_size();
    bVar5 = uVar2 != 0;
    if (bVar5) {
      uVar4 = 0;
      do {
        puVar3 = (undefined8 *)vector_at(v,uVar4);
        m = (method_conflict)*puVar3;
        s = method_signature(m);
        iVar1 = signature_compare(s,ret,args,size);
        if (iVar1 == 0) {
          vector_destroy(v);
          local_48 = m;
          goto LAB_00107dad;
        }
        uVar4 = uVar4 + 1;
        bVar5 = uVar4 < uVar2;
      } while (uVar4 != uVar2);
    }
    vector_destroy(v);
LAB_00107dad:
    if (bVar5) {
      return local_48;
    }
  }
  return (method)0x0;
}

Assistant:

method class_get_method_type_safe(vector v, type_id ret, type_id args[], size_t size)
{
	if (v != NULL)
	{
		size_t iterator, method_size = vector_size(v);

		for (iterator = 0; iterator < method_size; ++iterator)
		{
			method m = vector_at_type(v, iterator, method);

			if (signature_compare(method_signature(m), ret, args, size) == 0)
			{
				vector_destroy(v);
				return m;
			}
		}

		vector_destroy(v);
	}

	return NULL;
}